

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O1

void __thiscall
(anonymous_namespace)::buildCommand((anonymous_namespace)::BuildContext&,llbuild::ninja::Command*)::
NinjaCommandTask::inputsAvailable(llbuild::core::TaskInterface_(void *this,TaskInterface ti)

{
  int *piVar1;
  atomic<unsigned_int> *paVar2;
  __int_type_conflict _Var3;
  ulong uVar4;
  ulong uVar5;
  BuildContext *pBVar6;
  undefined4 uVar7;
  bool bVar8;
  hash_code commandHash;
  FileInfo *pFVar9;
  code *pcVar10;
  uint uVar11;
  _Any_data *p_Var12;
  bool bVar13;
  StringRef S;
  type addExecuteJob;
  BuildValue result;
  ValueType local_e0;
  TaskInterface local_c8;
  undefined1 local_b8 [88];
  CommandSignature CStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  S.Length = (pointer)ti.ctx;
  local_c8.impl = ti.impl;
  local_c8.ctx = S.Length;
  if ((*(byte *)(*(long *)((long)this + 8) + 0xa8) & 1) == 0) {
    S.Data = *(char **)(*(long *)((long)this + 0x10) + 0x78);
    commandHash = llvm::hash_value(*(llvm **)(*(long *)((long)this + 0x10) + 0x70),S);
    if (*(long *)(*(long *)((long)this + 0x10) + 8) ==
        *(long *)(*(long *)(*(long *)((long)this + 8) + 0x60) + 0x128)) {
      computeCommandResult(llbuild::basic::CommandSignature__const
                ((BuildValue *)local_b8,this,(CommandSignature)commandHash.value);
      uVar7 = local_b8._4_4_;
      if ((local_b8._0_4_ & ~SuccessfulCommand) != ExistingInput) {
        __assert_fail("(isExistingInput() || isSuccessfulCommand()) && \"invalid call for value kind\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                      ,0x114,"unsigned int (anonymous namespace)::BuildValue::getNumOutputs() const"
                     );
      }
      bVar13 = local_b8._4_4_ != 0;
      if (bVar13) {
        pFVar9 = anon_unknown.dwarf_b1e20::BuildValue::getNthOutputInfo((BuildValue *)local_b8,0);
        bVar8 = llbuild::basic::FileInfo::isMissing(pFVar9);
        if (!bVar8) {
          uVar11 = 1;
          do {
            bVar13 = uVar7 != uVar11;
            if (uVar7 == uVar11) break;
            pFVar9 = anon_unknown.dwarf_b1e20::BuildValue::getNthOutputInfo
                               ((BuildValue *)local_b8,uVar11);
            bVar8 = llbuild::basic::FileInfo::isMissing(pFVar9);
            uVar11 = uVar11 + 1;
          } while (!bVar8);
        }
      }
      anon_unknown.dwarf_b1e20::BuildValue::toValue(&local_e0,(BuildValue *)local_b8);
      goto LAB_0012c97a;
    }
    if (*(char *)((long)this + 0x1a) != '\x01') {
LAB_0012c9d2:
      pBVar6 = *(BuildContext **)((long)this + 8);
      pBVar6->numBuiltCommands = pBVar6->numBuiltCommands + 1;
      if (pBVar6->simulate == true) {
        if (pBVar6->quiet == false) {
          writeDescription((anonymous_namespace)::BuildContext&,llbuild::ninja::Command__
                    (pBVar6,*(Command **)((long)this + 0x10));
        }
      }
      else {
        if (*(char *)((long)this + 0x18) != '\x01') {
          if (*(char *)((long)this + 0x19) != '\0') {
            __assert_fail("!hasMissingInput",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                          ,0x4ba,
                          "virtual void (anonymous namespace)::buildCommand(BuildContext &, ninja::Command *)::NinjaCommandTask::inputsAvailable(core::TaskInterface)"
                         );
          }
          local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_c8.impl;
          local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_c8.ctx;
          local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)this;
          if (*(Pool **)(*(long *)((long)this + 0x10) + 0x68) ==
              ((pBVar6->manifest)._M_t.
               super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
               .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl)->consolePool)
          {
            local_48 = (code *)0x0;
            pcStack_40 = (code *)0x0;
            local_58._M_unused._M_object = (void *)0x0;
            local_58._8_8_ = 0;
            local_58._M_unused._M_object = operator_new(0x18);
            *(pointer *)local_58._M_unused._0_8_ =
                 local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            *(pointer *)((long)local_58._M_unused._0_8_ + 8) =
                 local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            *(pointer *)((long)local_58._M_unused._0_8_ + 0x10) =
                 local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            pcStack_40 = std::
                         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp:1256:36)>
                         ::_M_invoke;
            local_48 = std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp:1256:36)>
                       ::_M_manager;
            llbuild::basic::SerialQueue::async(&pBVar6->consoleQueue,(function<void_()> *)&local_58)
            ;
            if (local_48 == (code *)0x0) {
              return;
            }
            p_Var12 = &local_58;
            pcVar10 = local_48;
          }
          else {
            local_b8._0_4_ = ExistingInput;
            local_b8._4_4_ = 0;
            local_b8._8_4_ = 0;
            local_b8._12_4_ = 0;
            local_b8._24_4_ = 0x12e742;
            local_b8._28_4_ = 0;
            local_b8._16_4_ = 0x12e744;
            local_b8._20_4_ = 0;
            std::
            remove_reference<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp:1212:28)_&>
            ::type::operator()(&local_e0,(function<void_()> *)local_b8);
            if ((code *)CONCAT44(local_b8._20_4_,local_b8._16_4_) == (code *)0x0) {
              return;
            }
            p_Var12 = (_Any_data *)local_b8;
            pcVar10 = (code *)CONCAT44(local_b8._20_4_,local_b8._16_4_);
          }
          (*pcVar10)(p_Var12,p_Var12,__destroy_functor);
          return;
        }
        if (*(char *)((long)this + 0x19) != '\0') {
          anon_unknown.dwarf_b1e20::BuildContext::emitError
                    (pBVar6,"cannot build \'%s\' due to missing input",
                     *(undefined8 *)(**(long **)(*(long *)((long)this + 0x10) + 0x10) + 0x20));
          pBVar6 = *(BuildContext **)((long)this + 8);
          LOCK();
          paVar2 = &pBVar6->numFailedCommands;
          _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i + 1;
          UNLOCK();
          if ((pBVar6->numFailedCommandsToTolerate != 0) &&
             (_Var3 + 1 == pBVar6->numFailedCommandsToTolerate)) {
            anon_unknown.dwarf_b1e20::BuildContext::emitError
                      (pBVar6,"stopping build due to command failures");
            LOCK();
            (pBVar6->isCancelled)._M_base._M_i = true;
            UNLOCK();
          }
        }
      }
      goto LAB_0012c76f;
    }
    if (((*(byte *)(*(long *)((long)this + 0x10) + 0x110) & 4) == 0) &&
       ((*(char *)((long)this + 0x1b) != '\x01' ||
        (*(size_t *)((long)this + 0x20) != commandHash.value)))) {
      *(undefined1 *)((long)this + 0x1a) = 0;
    }
    if (*(char *)((long)this + 0x1a) != '\x01') goto LAB_0012c9d2;
    computeCommandResult(llbuild::basic::CommandSignature__const
              ((BuildValue *)local_b8,this,(CommandSignature)commandHash.value);
    uVar7 = local_b8._4_4_;
    if (local_b8._0_4_ != SuccessfulCommand) {
      __assert_fail("result.isSuccessfulCommand()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                    ,0x44a,
                    "bool (anonymous namespace)::buildCommand(BuildContext &, ninja::Command *)::NinjaCommandTask::canUpdateIfNewerWithResult(const BuildValue &)"
                   );
    }
    bVar13 = local_b8._4_4_ == 0;
    if (!bVar13) {
      pFVar9 = anon_unknown.dwarf_b1e20::BuildValue::getNthOutputInfo((BuildValue *)local_b8,0);
      bVar13 = llbuild::basic::FileInfo::isMissing(pFVar9);
      if (!bVar13) {
        uVar11 = 1;
        bVar13 = false;
        do {
          uVar4 = *(ulong *)((long)this + 0x28);
          uVar5 = (pFVar9->modTime).seconds;
          if (*(char *)(*(long *)((long)this + 8) + 0x92) == '\x01') {
            if ((uVar5 < uVar4) ||
               ((uVar5 == uVar4 && ((pFVar9->modTime).nanoseconds <= *(ulong *)((long)this + 0x30)))
               )) break;
          }
          else if ((uVar5 < uVar4) ||
                  ((uVar5 == uVar4 &&
                   ((pFVar9->modTime).nanoseconds < *(ulong *)((long)this + 0x30))))) break;
          bVar13 = uVar7 == uVar11;
          if (bVar13) break;
          pFVar9 = anon_unknown.dwarf_b1e20::BuildValue::getNthOutputInfo
                             ((BuildValue *)local_b8,uVar11);
          bVar8 = llbuild::basic::FileInfo::isMissing(pFVar9);
          uVar11 = uVar11 + 1;
        } while (!bVar8);
        goto LAB_0012c8c7;
      }
LAB_0012c9bc:
      if ((1 < (uint)local_b8._4_4_) &&
         ((void *)CONCAT44(local_b8._12_4_,local_b8._8_4_) != (void *)0x0)) {
        operator_delete__((void *)CONCAT44(local_b8._12_4_,local_b8._8_4_));
      }
      goto LAB_0012c9d2;
    }
LAB_0012c8c7:
    if (!bVar13) goto LAB_0012c9bc;
    LOCK();
    piVar1 = (int *)(*(long *)((long)this + 8) + 200);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  else {
LAB_0012c76f:
    local_b8._0_4_ = SkippedCommand;
    local_b8._4_4_ = 0;
    local_b8._8_4_ = 0;
    local_b8._12_4_ = 0;
    local_b8._16_4_ = 0;
    local_b8._20_4_ = 0;
    local_b8._24_4_ = 0;
    local_b8._28_4_ = 0;
    local_b8._32_4_ = 0;
    local_b8._36_8_ = 0;
    local_b8._44_8_ = 0;
    local_b8._52_8_ = 0;
    local_b8._60_8_ = 0;
    local_b8._68_8_ = 0;
    local_b8._76_4_ = 0;
    local_b8._80_4_ = 0;
    local_b8._84_4_ = 0;
    CStack_60.value = 0;
  }
  anon_unknown.dwarf_b1e20::BuildValue::toValue(&local_e0,(BuildValue *)local_b8);
  bVar13 = false;
LAB_0012c97a:
  llbuild::core::TaskInterface::complete(&local_c8,&local_e0,bVar13);
  if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((1 < (uint)local_b8._4_4_) &&
     ((void *)CONCAT44(local_b8._12_4_,local_b8._8_4_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT44(local_b8._12_4_,local_b8._8_4_));
  }
  return;
}

Assistant:

virtual void inputsAvailable(core::TaskInterface ti) override {
      // If the build is cancelled, skip everything.
      if (context.isCancelled) {
        return ti.complete(BuildValue::makeSkippedCommand().toValue());
      }

      // Ignore phony commands.
      //
      // FIXME: Is it right to bring this up-to-date when one of the inputs
      // indicated a failure? It probably doesn't matter.
      auto commandHash = CommandSignature(command->getCommandString());
      if (command->getRule() == context.manifest->getPhonyRule()) {
        // Get the result.
        BuildValue result = computeCommandResult(commandHash);

        // If any output is missing, then we always want to force the change to
        // propagate.
        bool forceChange = false;
        for (unsigned i = 0, e = result.getNumOutputs(); i != e; ++i) {
            if (result.getNthOutputInfo(i).isMissing()) {
                forceChange = true;
                break;
            }
        }

        return ti.complete(result.toValue(), forceChange);
      }

      // If it is legal to simply update the command, then if the command output
      // exists and is newer than all of the inputs, don't actually run the
      // command (just bring it up-to-date).
      if (canUpdateIfNewer) {
        // If this isn't a generator command and its command hash differs, we
        // can't update it.
        if (!command->hasGeneratorFlag() &&
            (!hasPriorResult || priorCommandHash != commandHash))
          canUpdateIfNewer = false;

        if (canUpdateIfNewer) {
          BuildValue result = computeCommandResult(commandHash);

          if (canUpdateIfNewerWithResult(result)) {
            // Update the count of the number of commands which have been
            // updated without being rerun.
            ++context.numCommandsUpdated;

            return ti.complete(result.toValue());
          }
        }
      }

      // Otherwise, actually run the command.

      ++context.numBuiltCommands;

      // If we are simulating the build, just print the description and
      // complete.
      if (context.simulate) {
        if (!context.quiet)
          writeDescription(context, command);
        return ti.complete(BuildValue::makeSkippedCommand().toValue());
      }

      // If not simulating, but this command should be skipped, then do nothing.
      if (shouldSkip) {
        // If this command had a failed input, treat it as having failed.
        if (hasMissingInput) {
          context.emitError("cannot build '%s' due to missing input",
                            command->getOutputs()[0]->getScreenPath().c_str());

          // Update the count of failed commands.
          context.incrementFailedCommands();
        }

        return ti.complete(BuildValue::makeSkippedCommand().toValue());
      }
      assert(!hasMissingInput);

      auto addExecuteJob = [this, ti](std::function<void(void)>&& jobFullyExecuted) mutable {
        // Otherwise, enqueue the job to run later.
        ti.spawn({command, [this, ti, done=std::move(jobFullyExecuted)] (QueueJobContext* qctx) mutable {
          // Suppress static analyzer false positive on generalized lambda capture
          // (rdar://problem/22165130).
#ifndef __clang_analyzer__
          // Take care to not rely on the ``this`` object, which may disappear
          // before the queue executes this block.
          BuildContext& localContext(context);
          ninja::Command* localCommand(command);
          auto bucket = qctx->laneID();

          if (localContext.profileFP) {
            localContext.consoleQueue.async(
              [&localContext=localContext, localCommand=localCommand, bucket] {
                uint64_t startTime = getTimeInMicroseconds();
                fprintf(localContext.profileFP,
                        ("{ \"name\": \"%s\", \"ph\": \"B\", \"pid\": 0, "
                         "\"tid\": %d, \"ts\": %llu},\n"),
                        localCommand->getEffectiveDescription().c_str(), bucket,
                        static_cast<unsigned long long>(startTime));
              });
          }

          executeCommand(ti, qctx);

          if (localContext.profileFP) {
            localContext.consoleQueue.async(
              [&localContext=localContext, localCommand=localCommand, bucket] {
                uint64_t endTime = getTimeInMicroseconds();
                fprintf(localContext.profileFP,
                        ("{ \"name\": \"%s\", \"ph\": \"E\", \"pid\": 0, "
                         "\"tid\": %d, \"ts\": %llu},\n"),
                        localCommand->getEffectiveDescription().c_str(), bucket,
                        static_cast<unsigned long long>(endTime));
              });
          }
          done();
#endif
        }});
      };

      bool isConsolePool = command->getExecutionPool() == context.manifest->getConsolePool();
      if (isConsolePool) {
        context.consoleQueue.async([addExecuteJob=std::move(addExecuteJob)] () mutable {
          std::promise<void> p;
          auto result = p.get_future();
          addExecuteJob([&p]{ p.set_value(); });
          result.get();
        });
      } else {
        addExecuteJob([]{});
      }
    }